

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusFunction.hpp
# Opt level: O0

void __thiscall
OpenMD::DumpStatusFunction::writeStatus
          (DumpStatusFunction *this,int functionCount,int param_3,
          DynamicVector<double,_std::allocator<double>_> *param_4,RealType param_5)

{
  SnapshotManager *this_00;
  Snapshot *this_01;
  int in_ESI;
  long in_RDI;
  Snapshot *curSnapshot;
  StatWriter *in_stack_00000120;
  DumpWriter *in_stack_000001b0;
  Stats *in_stack_00000910;
  
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
  this_01 = SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::setTime(this_01,(double)in_ESI);
  Stats::collectStats(in_stack_00000910);
  StatWriter::writeStat(in_stack_00000120);
  DumpWriter::writeDumpAndEor(in_stack_000001b0);
  return;
}

Assistant:

virtual void writeStatus(int functionCount, int,
                             const DynamicVector<RealType>&, RealType) {
      Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
      curSnapshot->setTime(functionCount);
      stats->collectStats();
      statWriter->writeStat();

      dumpWriter->writeDumpAndEor();
    }